

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O3

int __thiscall QFSFileEngine::open(QFSFileEngine *this,char *__file,int __oflag,...)

{
  QFSFileEnginePrivate *this_00;
  bool bVar1;
  undefined7 extraout_var;
  storage_type *in_RCX;
  int iVar2;
  long in_FS_OFFSET;
  QByteArrayView ba;
  ProcessOpenModeResult local_68;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  bVar1 = QFileSystemEntry::isEmpty(&this_00->fileEntry);
  if (bVar1) {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"No file name specified";
    QString::fromLatin1((QString *)&local_68,(QString *)0x16,ba);
    local_48.d.d = (Data *)local_68._0_8_;
    local_48.d.ptr = (char16_t *)local_68.error.d.d;
    local_48.d.size = (qsizetype)local_68.error.d.ptr;
    QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,OpenError,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar2 = 0;
  }
  else {
    local_68.error.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.error.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68.error.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    processOpenModeFlags
              (&local_68,(QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)SUB84(__file,0));
    if (local_68.ok == false) {
      QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,OpenError,&local_68.error);
      iVar2 = 0;
    }
    else {
      (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
           (Int)local_68.openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
      this_00->lastFlushFailed = false;
      this_00->field_0xc2 = this_00->field_0xc2 & 0xfb;
      this_00->fh = (FILE *)0x0;
      this_00->fd = -1;
      bVar1 = QFSFileEnginePrivate::nativeOpen(this_00,local_68.openMode,___oflag);
      iVar2 = (int)CONCAT71(extraout_var,bVar1);
    }
    if (&(local_68.error.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_68.error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_68.error.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::open(QIODevice::OpenMode openMode,
                         std::optional<QFile::Permissions> permissions)
{
    Q_ASSERT_X(openMode & QIODevice::Unbuffered, "QFSFileEngine::open",
               "QFSFileEngine no longer supports buffered mode; upper layer must buffer");

    Q_D(QFSFileEngine);
    if (d->fileEntry.isEmpty()) {
        qWarning("QFSFileEngine::open: No file name specified");
        setError(QFile::OpenError, "No file name specified"_L1);
        return false;
    }

    const ProcessOpenModeResult res = processOpenModeFlags(openMode);
    if (!res.ok) {
        setError(QFileDevice::OpenError, res.error);
        return false;
    }

    d->openMode = res.openMode;
    d->lastFlushFailed = false;
    d->tried_stat = 0;
    d->fh = nullptr;
    d->fd = -1;

    return d->nativeOpen(d->openMode, permissions);
}